

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_LengthValue * __thiscall
ON_LengthValue::ChangeLength
          (ON_LengthValue *__return_storage_ptr__,ON_LengthValue *this,double length_value)

{
  bool bVar1;
  ON_LengthValue local_68;
  undefined1 local_21;
  double local_20;
  double length_value_local;
  ON_LengthValue *this_local;
  ON_LengthValue *rc;
  
  local_21 = 0;
  local_20 = length_value;
  length_value_local = (double)this;
  this_local = __return_storage_ptr__;
  ON_LengthValue(__return_storage_ptr__,this);
  bVar1 = ON_IsValid(local_20);
  if (bVar1) {
    Create(&local_68,local_20,&this->m_length_unit_system,this->m_context_locale_id,
           this->m_string_format);
    operator=(__return_storage_ptr__,&local_68);
    ~ON_LengthValue(&local_68);
  }
  else {
    ON_wString::operator=(&__return_storage_ptr__->m_length_as_string,&ON_wString::EmptyString);
    __return_storage_ptr__->m_length = Unset.m_length;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_LengthValue ON_LengthValue::ChangeLength(
  double length_value
) const
{
  ON_LengthValue rc(*this);
  if (!ON_IsValid(length_value))
  {
    rc.m_length_as_string = ON_wString::EmptyString;
    rc.m_length = ON_LengthValue::Unset.m_length;
  }
  else
  {
    rc = ON_LengthValue::Create(length_value, m_length_unit_system, m_context_locale_id, m_string_format);
  }
  return rc;
}